

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O3

ostream * PyreNet::operator<<(ostream *os,Layer *l)

{
  Perceptron *pPVar1;
  uint uVar2;
  ostream *poVar3;
  activationType activation;
  Perceptron *p;
  Perceptron *p_00;
  string local_48;
  
  uVar2 = (*l->activation->_vptr_Activation[1])();
  ActivationFactory::toString_abi_cxx11_(&local_48,(ActivationFactory *)(ulong)uVar2,activation);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  pPVar1 = (l->nodes).super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (p_00 = (l->nodes).
              super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>._M_impl.
              super__Vector_impl_data._M_start; p_00 != pPVar1; p_00 = p_00 + 1) {
    poVar3 = operator<<(os,p_00);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream& os, const Layer &l) {
        os << ActivationFactory::toString(l.activation->type()) << " ";
        os << l.nodes.size() << " ";
        for (const Perceptron& p : l.nodes)
            os << p << " ";
        return os;
    }